

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fadop.h
# Opt level: O2

value_type * __thiscall
FadBinaryAdd<Fad<Fad<double>_>,_Fad<Fad<double>_>_>::val
          (value_type *__return_storage_ptr__,
          FadBinaryAdd<Fad<Fad<double>_>,_Fad<Fad<double>_>_> *this)

{
  FadExpr<FadBinaryAdd<Fad<double>,_Fad<double>_>_> local_18;
  
  local_18.fadexpr_.left_ = &this->left_->val_;
  local_18.fadexpr_.right_ = &this->right_->val_;
  Fad<double>::Fad<FadBinaryAdd<Fad<double>,Fad<double>>>(__return_storage_ptr__,&local_18);
  return __return_storage_ptr__;
}

Assistant:

const value_type val() const {return left_.val() + right_.val();}